

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

const_iterator * __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::begin(const_iterator *__return_storage_ptr__,
       sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       *this)

{
  const_nonempty_iterator local_68;
  const_nonempty_iterator local_48;
  
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  nonempty_begin(&local_48,&this->table);
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  nonempty_end(&local_68,&this->table);
  (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
  (__return_storage_ptr__->end).col_current = local_68.col_current;
  (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
  (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
  (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
  (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
  (__return_storage_ptr__->pos).col_current = local_48.col_current;
  __return_storage_ptr__->ht = this;
  sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const {
    return const_iterator(this, table.nonempty_begin(), table.nonempty_end());
  }